

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void string_suite::fail_escape(void)

{
  view_type *pvVar1;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [4];
  
  decoder.current.scan._260_4_ = 0x225c22;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<4ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [4])((long)&decoder.current.scan + 0x104));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6ea,"void string_suite::fail_escape()",local_148,&local_14c);
  pvVar1 = trial::protocol::json::detail::basic_decoder<char>::literal
                     ((basic_decoder<char> *)local_140);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[4]>
            ("decoder.literal()","\"\\\"\\\\\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6eb,"void string_suite::fail_escape()",pvVar1,"\"\\\"");
  return;
}

Assistant:

void fail_escape()
{
    const char input[] = "\"\\\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\\\"");
}